

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor,Options *options)

{
  pointer pcVar1;
  bool in_CL;
  
  this->descriptor_ = descriptor;
  ClassName_abi_cxx11_(&this->classname_,(cxx *)descriptor,(EnumDescriptor *)0x0,in_CL);
  (this->options_).dllexport_decl._M_dataplus._M_p =
       (pointer)&(this->options_).dllexport_decl.field_2;
  pcVar1 = (options->dllexport_decl)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->options_,pcVar1,pcVar1 + (options->dllexport_decl)._M_string_length);
  (this->options_).safe_boundary_check = options->safe_boundary_check;
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor,
                             const Options& options)
  : descriptor_(descriptor),
    classname_(ClassName(descriptor, false)),
    options_(options) {
}